

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

QNode_t * __thiscall
PolygonTriangulation::fusion_sinks(PolygonTriangulation *this,QNode_t *top_sink,QNode_t *btm_sink)

{
  reference pvVar1;
  reference pvVar2;
  value_type *btm_trap;
  value_type *top_trap;
  QNode_t *btm_sink_local;
  QNode_t *top_sink_local;
  PolygonTriangulation *this_local;
  
  pvVar1 = std::
           vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ::operator[](&this->trapezoids_,(ulong)top_sink->key_index);
  pvVar2 = std::
           vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ::operator[](&this->trapezoids_,(ulong)btm_sink->key_index);
  pvVar1->min_y = pvVar2->min_y;
  pvVar1->below1 = pvVar2->below1;
  pvVar1->below2 = pvVar2->below2;
  return top_sink;
}

Assistant:

PolygonTriangulation::QNode_t* PolygonTriangulation::fusion_sinks(QNode_t *top_sink,
                                                                  QNode_t *btm_sink)
{
  auto &top_trap = trapezoids_[top_sink->key_index];
  const auto &btm_trap = trapezoids_[btm_sink->key_index];

  top_trap.min_y = btm_trap.min_y;

  // used with the second version of update_xsplit
  top_trap.below1 = btm_trap.below1;
  top_trap.below2 = btm_trap.below2;

  //top_trap.above1 = (kInvalidIndex != top_trap.above2) ? top_trap.above2 : top_trap.above1;
  //top_trap.above2 = kInvalidIndex; //

  return top_sink;
}